

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
               (Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>
                *m)

{
  uint uVar1;
  uint uVar2;
  Dimension DVar3;
  uint uVar4;
  Dimension DVar5;
  pointer pIVar6;
  pointer puVar7;
  bool bVar8;
  uint __tmp;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  anon_class_1_0_00000001 local_67;
  anon_class_1_0_00000001 local_66;
  anon_class_1_0_00000001 local_65;
  undefined4 local_64;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  anon_class_32_4_5df6e713 local_48;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_60,m);
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48.col = pIVar6 + 5;
  uVar1 = pIVar6[5].super_Chain_column_option.pivot_;
  bVar8 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::___persistence_matrix::Column_types)7,false,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                    (pIVar6 + 3,local_48.col,(anon_class_1_0_00000001 *)&local_64,
                     (anon_class_8_1_e4bd5e45 *)&local_48,&local_67,&local_66,&local_65);
  uVar2 = pIVar6[5].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    DVar3 = pIVar6[3].super_Column_dimension_option.dim_;
    uVar4 = pIVar6[3].super_Chain_column_option.pivot_;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[3].super_Chain_column_option.pivot_ = uVar2;
    DVar5 = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
    pIVar6[3].super_Column_dimension_option.dim_ = DVar5;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_48.col = (Column *)0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_60.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_48);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_60,m);
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48.col = pIVar6 + 5;
  uVar1 = pIVar6[5].super_Chain_column_option.pivot_;
  bVar8 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::___persistence_matrix::Column_types)7,false,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                    (pIVar6 + 4,local_48.col,(anon_class_1_0_00000001 *)&local_64,
                     (anon_class_8_1_e4bd5e45 *)&local_48,&local_67,&local_66,&local_65);
  uVar2 = pIVar6[5].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    DVar3 = pIVar6[4].super_Column_dimension_option.dim_;
    uVar4 = pIVar6[4].super_Chain_column_option.pivot_;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[4].super_Chain_column_option.pivot_ = uVar2;
    DVar5 = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
    pIVar6[4].super_Column_dimension_option.dim_ = DVar5;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_48.col = (Column *)0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_60.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),&local_48);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_60,m);
  local_48.this = &m->matrix_;
  local_67 = (anon_class_1_0_00000001)0x1;
  local_64 = 5;
  local_48.col = (m->matrix_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3;
  local_48.coefficient = (Field_element *)&local_67;
  local_48.sourceColumnIndex = (Index *)&local_64;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
  ::
  _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>::multiply_target_and_add_to(unsigned_int,bool_const&,unsigned_int)::_lambda()_1_>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
              *)local_48.this,local_48.col,&local_48);
  local_48.col = (Column *)CONCAT44(local_48.col._4_4_,5);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_60.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),&local_48);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_60,m);
  local_48.col = (Column *)0x400000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             (local_60.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4),&local_48);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_60,m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void test_chain_operation(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {4, 5};
  } else {
    columns[5] = {{3, 2}, {4, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {3, 5};
  } else {
    columns[5] = {{3, 3}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_target_and_add_to(5, 3, 3);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[3] = {5};
  } else {
    columns[3] = {{3, 1}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(4, 5, 4);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {3, 4};
  } else {
    columns[4] = {{3, 3}, {4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
}